

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Parse *pParse;
  Expr *pExpr;
  Expr *p;
  int iVar1;
  int iVar2;
  ExprList *pEVar3;
  Expr *extraout_RDX;
  Expr *pE;
  Expr *extraout_RDX_00;
  Expr *extraout_RDX_01;
  Expr *extraout_RDX_02;
  ExprList_item *pEVar4;
  int iVar5;
  ExprList_item *pEVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  int iCol;
  int local_6c;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = -0x55555556;
  pParse = pNC->pParse;
  if (0 < pOrderBy->nExpr) {
    iVar2 = pSelect->pEList->nExpr;
    pEVar4 = pOrderBy->a;
    iVar5 = 0;
    pE = (Expr *)pOrderBy;
    do {
      pExpr = pEVar4->pExpr;
      p = pExpr;
      while (p != (Expr *)0x0) {
        if ((p->flags & 0x82000) == 0) {
LAB_0018396a:
          if ((*zType != 'G') &&
             (local_6c = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,pE), pE = extraout_RDX
             , 0 < local_6c)) {
LAB_001839ae:
            (pEVar4->u).x.iOrderByCol = (u16)local_6c;
            break;
          }
          iVar1 = sqlite3ExprIsInteger(p,&local_6c,(Parse *)0x0);
          if (iVar1 == 0) {
            (pEVar4->u).x.iOrderByCol = 0;
            iVar1 = sqlite3ResolveExprNames(pNC,pExpr);
            if (iVar1 == 0) {
              pEVar3 = pSelect->pEList;
              pE = extraout_RDX_00;
              if (0 < pEVar3->nExpr) {
                lVar7 = 8;
                lVar8 = 0;
                do {
                  iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                             *(Expr **)((long)pEVar3->a + lVar7 + -8),-1);
                  pE = extraout_RDX_01;
                  if (iVar1 == 0) {
                    if (pSelect->pWin != (Window *)0x0) {
                      local_68.pParse = (Parse *)0x0;
                      local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
                      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
                      local_68.walkerDepth = 0;
                      local_68.eCode = 0;
                      local_68.mWFlags = 0;
                      local_68.xExprCallback = resolveRemoveWindowsCb;
                      local_68.u.pSelect = pSelect;
                      sqlite3WalkExprNN(&local_68,pExpr);
                      pE = extraout_RDX_02;
                    }
                    (pEVar4->u).x.iOrderByCol = (short)lVar8 + 1;
                  }
                  lVar8 = lVar8 + 1;
                  pEVar3 = pSelect->pEList;
                  lVar7 = lVar7 + 0x18;
                } while (lVar8 < pEVar3->nExpr);
              }
              break;
            }
          }
          else {
            pE = (Expr *)0xffff0000;
            if (0xffff0000 < local_6c - 0x10000U) goto LAB_001839ae;
            resolveOutOfRangeError(pParse,zType,iVar5 + 1,iVar2,p);
          }
          iVar2 = 1;
          goto LAB_00183a7f;
        }
        if ((p->flags >> 0x13 & 1) == 0) {
          if (p->op != 'r') goto LAB_0018396a;
          pEVar6 = (ExprList_item *)&p->pLeft;
        }
        else {
          pEVar6 = ((p->x).pList)->a;
        }
        p = pEVar6->pExpr;
      }
      iVar5 = iVar5 + 1;
      pEVar4 = pEVar4 + 1;
    } while (iVar5 < pOrderBy->nExpr);
  }
  iVar2 = sqlite3ResolveOrderGroupBy(pParse,pSelect,pOrderBy,zType);
LAB_00183a7f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  assert( pOrderBy!=0 );
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pE);
    if( NEVER(pE2==0) ) continue;
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol, 0) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult, pE2);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        /* Since this expression is being changed into a reference
        ** to an identical expression in the result set, remove all Window
        ** objects belonging to the expression from the Select.pWin list. */
        windowRemoveExprFromSelect(pSelect, pE);
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}